

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetCmn.h
# Opt level: O0

void __thiscall anon_unknown.dwarf_4eca2::InitSocket::InitSocket(InitSocket *this)

{
  InitSocket *this_local;
  
  return;
}

Assistant:

InitSocket()
	{
#if defined (SZ_OS_WINDOWS)
		WSADATA WS;
		if (WSAStartup(MAKEWORD(2, 2), &WS) != 0)
		{
			puts("WSAStartup failed!");
			abort();
		}
#endif
	}